

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O0

ssize_t __thiscall
wasm::LEB<unsigned_long,_unsigned_char>::read
          (LEB<unsigned_long,_unsigned_char> *this,int __fd,void *__buf,size_t __nbytes)

{
  ParseException *pPVar1;
  undefined4 in_register_00000034;
  ulong local_c8;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_85;
  allocator<char> local_71;
  string local_70;
  ulong local_50;
  unsigned_long unused_bits;
  unsigned_long unused_bits_mask;
  unsigned_long significant_payload;
  mask_type payload_mask;
  unsigned_long payload;
  bool last;
  ulong uStack_20;
  uchar byte;
  unsigned_long shift;
  function<unsigned_char_()> *get_local;
  LEB<unsigned_long,_unsigned_char> *this_local;
  
  this->value = 0;
  uStack_20 = 0;
  shift = (unsigned_long)CONCAT44(in_register_00000034,__fd);
  get_local = (function<unsigned_char_()> *)this;
  while( true ) {
    payload._7_1_ =
         std::function<unsigned_char_()>::operator()
                   ((function<unsigned_char_()> *)CONCAT44(in_register_00000034,__fd));
    payload._6_1_ = ((payload._7_1_ & 0x80) != 0 ^ 0xffU) & 1;
    payload_mask = (mask_type)(int)(payload._7_1_ & 0x7f);
    if (uStack_20 == 0) {
      local_c8 = 0xffffffffffffffff;
    }
    else {
      local_c8 = (1L << (0x40 - (byte)uStack_20 & 0x3f)) - 1;
    }
    significant_payload = local_c8;
    unused_bits_mask = local_c8 & payload_mask;
    this->value = unused_bits_mask << ((byte)uStack_20 & 0x3f) | this->value;
    unused_bits = (local_c8 ^ 0xffffffffffffffff) & 0x7f;
    local_50 = payload_mask & unused_bits;
    if (local_50 != 0) {
      local_85 = 1;
      pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Unused non-negative LEB bits must be 0s",&local_71);
      ParseException::ParseException(pPVar1,&local_70);
      local_85 = 0;
      __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
    }
    if (payload._6_1_ != 0) {
      return (ssize_t)this;
    }
    uStack_20 = uStack_20 + 7;
    if (0x3f < uStack_20) break;
    local_50 = 0;
    payload._6_1_ = 0;
  }
  pPVar1 = (ParseException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"LEB overflow",&local_a9);
  ParseException::ParseException(pPVar1,&local_a8);
  __cxa_throw(pPVar1,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

LEB<T, MiniT>& read(std::function<MiniT()> get) {
    value = 0;
    T shift = 0;
    MiniT byte;
    while (1) {
      byte = get();
      bool last = !(byte & 128);
      T payload = byte & 127;
      using mask_type = typename std::make_unsigned<T>::type;
      auto payload_mask = 0 == shift
                            ? ~mask_type(0)
                            : ((mask_type(1) << (sizeof(T) * 8 - shift)) - 1u);
      T significant_payload = payload_mask & payload;
      value |= significant_payload << shift;
      T unused_bits_mask = ~payload_mask & 127;
      T unused_bits = payload & unused_bits_mask;
      if (std::is_signed_v<T> && value < 0) {
        if (unused_bits != unused_bits_mask) {
          throw ParseException("Unused negative LEB bits must be 1s");
        }
      } else {
        if (unused_bits != 0) {
          throw ParseException("Unused non-negative LEB bits must be 0s");
        }
      }
      if (last) {
        break;
      }
      shift += 7;
      if (size_t(shift) >= sizeof(T) * 8) {
        throw ParseException("LEB overflow");
      }
    }
    // If signed LEB, then we might need to sign-extend.
    if constexpr (std::is_signed_v<T>) {
      shift += 7;
      if ((byte & 64) && size_t(shift) < 8 * sizeof(T)) {
        size_t sext_bits = 8 * sizeof(T) - size_t(shift);
        value <<= sext_bits;
        value >>= sext_bits;
        if (value >= 0) {
          throw ParseException(
            " LEBsign-extend should produce a negative value");
        }
      }
    }
    return *this;
  }